

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::KahanSumState,double,duckdb::DoubleSumOperation<duckdb::KahanAdd>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  double *pdVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar5 = 0;
      uVar6 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          uVar11 = puVar1[uVar5];
        }
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
        uVar10 = uVar9;
        if (uVar11 != 0) {
          uVar10 = uVar6;
          if (uVar11 == 0xffffffffffffffff) {
            if (uVar6 < uVar9) {
              dVar13 = *(double *)(state + 0x10);
              dVar14 = *(double *)(state + 8);
              do {
                dVar13 = *(double *)(pdVar3 + uVar6 * 8) - dVar13;
                dVar15 = dVar14 + dVar13;
                dVar13 = (dVar15 - dVar14) - dVar13;
                uVar6 = uVar6 + 1;
                dVar14 = dVar15;
              } while (uVar9 != uVar6);
              *state = '\x01';
              *(double *)(state + 0x10) = dVar13;
              *(double *)(state + 8) = dVar15;
              uVar10 = uVar9;
            }
          }
          else if (uVar6 < uVar9) {
            uVar10 = 0;
            do {
              if ((uVar11 >> (uVar10 & 0x3f) & 1) != 0) {
                *state = '\x01';
                dVar13 = *(double *)(pdVar3 + uVar10 * 8 + uVar6 * 8) - *(double *)(state + 0x10);
                dVar14 = *(double *)(state + 8) + dVar13;
                *(double *)(state + 0x10) = (dVar14 - *(double *)(state + 8)) - dVar13;
                *(double *)(state + 8) = dVar14;
              }
              uVar10 = uVar10 + 1;
            } while ((uVar6 - uVar9) + uVar10 != 0);
            uVar10 = uVar6 + uVar10;
          }
        }
        uVar6 = uVar10;
        uVar5 = uVar5 + 1;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      pdVar2 = (double *)input->data;
      auVar12._8_4_ = (int)(count >> 0x20);
      auVar12._0_8_ = count;
      auVar12._12_4_ = 0x45300000;
      *state = '\x01';
      dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)count) - 4503599627370496.0)) * *pdVar2 -
               *(double *)(state + 0x10);
      dVar14 = *(double *)(state + 8) + dVar13;
      *(double *)(state + 0x10) = (dVar14 - *(double *)(state + 8)) - dVar13;
      *(double *)(state + 8) = dVar14;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        dVar13 = *(double *)(state + 0x10);
        iVar7 = 0;
        dVar14 = *(double *)(state + 8);
        do {
          iVar8 = iVar7;
          if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)(local_68.sel)->sel_vector[iVar7];
          }
          dVar15 = dVar14 + (*(double *)(local_68.data + iVar8 * 8) - dVar13);
          dVar13 = (dVar15 - dVar14) - (*(double *)(local_68.data + iVar8 * 8) - dVar13);
          iVar7 = iVar7 + 1;
          dVar14 = dVar15;
        } while (count != iVar7);
        *state = '\x01';
        *(double *)(state + 0x10) = dVar13;
        *(double *)(state + 8) = dVar15;
      }
    }
    else if (count != 0) {
      psVar4 = (local_68.sel)->sel_vector;
      iVar7 = 0;
      do {
        iVar8 = iVar7;
        if (psVar4 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar4[iVar7];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar8 >> 6]
             >> (iVar8 & 0x3f) & 1) != 0) {
          *state = '\x01';
          dVar13 = *(double *)(state + 8) +
                   (*(double *)(local_68.data + iVar8 * 8) - *(double *)(state + 0x10));
          *(double *)(state + 0x10) =
               (dVar13 - *(double *)(state + 8)) -
               (*(double *)(local_68.data + iVar8 * 8) - *(double *)(state + 0x10));
          *(double *)(state + 8) = dVar13;
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}